

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_binary<unsigned_int>
          (XMLWriter *this,char *name,vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  pointer puVar1;
  ostream *poVar2;
  
  std::istream::tellg();
  tab(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"<");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2," ofs=\"");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,"\" size=\"");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\"/>");
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    std::ostream::write(&this->field_0x220,(long)puVar1);
    return;
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const std::vector<T>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    if (vec.size()) bin.write((char*)vec.data(),vec.size()*sizeof(T));
  }